

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-features.h
# Opt level: O1

string * __thiscall
wasm::FeatureSet::toString_abi_cxx11_(string *__return_storage_ptr__,FeatureSet *this)

{
  uint uVar1;
  Feature f;
  Feature extraout_EDX;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint uVar2;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = 1;
  do {
    f = (Feature)in_RDX;
    if ((this->features & uVar2) != 0) {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        f = extraout_EDX;
      }
      toString_abi_cxx11_(&local_58,(FeatureSet *)(ulong)uVar2,f);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      in_RDX = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_00;
      }
    }
    uVar1 = uVar2 & 0x1fffff;
    uVar2 = uVar2 * 2;
  } while (uVar1 != 0);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const {
    std::string ret;
    uint32_t x = 1;
    while (x & Feature::All) {
      if (features & x) {
        if (!ret.empty()) {
          ret += ", ";
        }
        ret += toString(Feature(x));
      }
      x <<= 1;
    }
    return ret;
  }